

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O3

int loop_once(int epoll,int sfd,epoll_event *event)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  int *piVar5;
  ulong uVar6;
  ssize_t sVar7;
  int *extraout_RAX;
  ulong uVar8;
  undefined8 uVar9;
  char *__format;
  undefined8 uStack_370;
  undefined1 local_368 [8];
  epoll_event events [64];
  sockaddr client_addr;
  socklen_t local_38;
  int local_34;
  socklen_t addrlen;
  
  uVar2 = epoll_wait(epoll,(epoll_event *)local_368,0x40,-1);
  if ((int)uVar2 < 1) {
    return uVar2;
  }
  uVar8 = 0;
  local_34 = sfd;
LAB_001067fa:
  if ((*(uint *)(local_368 + uVar8 * 0xc) & 0x19) == 1) {
    if (*(int *)((long)&events[uVar8 - 1].data + 4) != sfd) {
      uVar6 = (ulong)(uint)BUF_SIZE;
      lVar1 = -(uVar6 + 0xf & 0xfffffffffffffff0);
      do {
        iVar3 = *(int *)((long)&events[uVar8 - 1].data + 4);
        *(undefined8 *)((long)&uStack_370 + lVar1) = 0x10691d;
        sVar7 = read(iVar3,local_368 + lVar1,(long)(int)uVar6);
        if (sVar7 == -1) {
          *(undefined8 *)((long)&uStack_370 + lVar1) = 0x106932;
          piVar5 = __errno_location();
          sfd = local_34;
          if (*piVar5 == 0xb) goto LAB_00106978;
          *(undefined8 *)((long)&uStack_370 + lVar1) = 0x106941;
          sk_on_read_error(epoll,iVar3);
        }
        else if (sVar7 == 0) goto LAB_00106959;
        *(undefined8 *)((long)&uStack_370 + lVar1) = 0x106951;
        sk_on_read_data(epoll,iVar3,local_368 + lVar1,(int)sVar7);
        uVar6 = (ulong)(uint)BUF_SIZE;
      } while( true );
    }
LAB_0010682a:
    do {
      local_38 = 0x10;
      iVar3 = accept(sfd,(sockaddr *)&events[0x3f].data,&local_38);
      if (iVar3 != -1) {
        iVar4 = make_socket_non_block(iVar3);
        if (iVar4 == -1) {
          __format = "\x1b[31mERROR: %s: %s: %d: cannot set flags!\x1b[m\n";
          uVar9 = 0x6f;
        }
        else {
          (event->data).fd = iVar3;
          event->events = 0x80000001;
          iVar4 = epoll_ctl(epoll,1,iVar3,(epoll_event *)event);
          if (iVar4 != -1) {
            sk_on_connected(epoll,iVar3);
            goto LAB_0010682a;
          }
          __format = "\x1b[31mERROR: %s: %s: %d: cannot add to epoll!\x1b[m\n";
          uVar9 = 0x78;
        }
        printf(__format,"epoll.cpp","loop_once",uVar9);
        sk_on_error(epoll);
        return extraout_EAX;
      }
      piVar5 = __errno_location();
      if (*piVar5 == 0xb) goto LAB_00106978;
      printf("\x1b[31mERROR: %s: %s: %d: cannot accept new socket!\x1b[m\n","epoll.cpp","loop_once",
             0x68);
    } while( true );
  }
  printf("\x1b[31mERROR: %s: %s: %d: socket fd error!\x1b[m\n","epoll.cpp","loop_once",0x5a);
  iVar3 = close(*(int *)((long)&events[uVar8 - 1].data + 4));
  goto LAB_0010697c;
LAB_00106959:
  iVar4 = *(int *)((long)&events[uVar8 - 1].data + 4);
  *(undefined8 *)((long)&uStack_370 + lVar1) = 0x106962;
  close(iVar4);
  *(undefined8 *)((long)&uStack_370 + lVar1) = 0x10696c;
  sk_on_disconnected(epoll,iVar3);
  piVar5 = extraout_RAX;
  sfd = local_34;
LAB_00106978:
  iVar3 = (int)piVar5;
LAB_0010697c:
  uVar8 = uVar8 + 1;
  if (uVar8 == uVar2) {
    return iVar3;
  }
  goto LAB_001067fa;
}

Assistant:

static int loop_once(int epoll, int sfd, struct epoll_event &event)
{
    struct epoll_event events[MAX_EVENTS];
    int cnt = epoll_wait(epoll, events, MAX_EVENTS, -1);

    for (int i = 0; i < cnt; i++) {
        if ((events[i].events & EPOLLERR) || (events[i].events & EPOLLHUP) || !(events[i].events & EPOLLIN)) {
            LOGE("socket fd error!");
            close(events[i].data.fd);
            continue;

        } else if (events[i].data.fd == sfd) {
            while (1) {
                struct sockaddr client_addr;
                socklen_t addrlen = sizeof(struct sockaddr);

                int sd = accept(sfd, &client_addr, &addrlen);
                if (sd == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        break;
                    } else {
                        LOGE("cannot accept new socket!");
                        continue;
                    }
                }

                int res = make_socket_non_block(sd);
                if (res == -1) {
                    LOGE("cannot set flags!");
                    sk_on_error(epoll);
                    return -1;
                }

                event.data.fd = sd;
                event.events  = EPOLLET | EPOLLIN;
                res = epoll_ctl(epoll, EPOLL_CTL_ADD, sd, &event);
                if (res == -1) {
                    LOGE("cannot add to epoll!");
                    sk_on_error(epoll);
                    return -1;
                }

                sk_on_connected(epoll, sd);
            }
        } else {
            ssize_t len;
            byte buf[BUF_SIZE];

            while (1) {
                int fd = events[i].data.fd;
                len = read(fd, buf, BUF_SIZE);
                if (len == -1) {
                    if (errno == EAGAIN) {
                        break;
                    }

                    sk_on_read_error(epoll, fd);

                } else if (len == 0) {
                    close(events[i].data.fd);
                    sk_on_disconnected(epoll, fd);
                    break;
                }

                sk_on_read_data(epoll, fd, buf, len);
            }
        }
    }
    return 0;
}